

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

void xmlXPtrEndPointFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  int *piVar2;
  int *piVar3;
  xmlXPathObjectPtr pxVar4;
  xmlXPathObjectPtr pxVar5;
  xmlLocationSetPtr obj;
  long lVar6;
  int iVar7;
  xmlNodePtr node;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    iVar7 = 0xc;
    goto LAB_001ebcfa;
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    iVar7 = 0x17;
    goto LAB_001ebcfa;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((xVar1 = ctxt->value->type, xVar1 != XPATH_NODESET && (xVar1 != XPATH_LOCATIONSET)))) {
    iVar7 = 0xb;
    goto LAB_001ebcfa;
  }
  pxVar4 = valuePop(ctxt);
  pxVar5 = pxVar4;
  if (pxVar4->type == XPATH_NODESET) {
    pxVar5 = xmlXPtrNewLocationSetNodeSet(pxVar4->nodesetval);
    xmlXPathFreeObject(pxVar4);
    if (pxVar5 != (xmlXPathObjectPtr)0x0) goto LAB_001ebbd7;
  }
  else {
LAB_001ebbd7:
    obj = (xmlLocationSetPtr)(*xmlMalloc)(0x10);
    if (obj != (xmlLocationSetPtr)0x0) {
      obj->locNr = 0;
      obj->locMax = 0;
      obj->locTab = (xmlXPathObjectPtr *)0x0;
      piVar2 = (int *)pxVar5->user;
      if ((piVar2 != (int *)0x0) && (0 < *piVar2)) {
        lVar6 = 0;
        do {
          piVar3 = *(int **)(*(long *)(piVar2 + 2) + lVar6 * 8);
          if (piVar3 != (int *)0x0) {
            if (*piVar3 == 6) {
              node = *(xmlNodePtr *)(piVar3 + 0xe);
              if (node != (xmlNodePtr)0x0) {
                if ((node->type | XML_ATTRIBUTE_DECL) != XML_NAMESPACE_DECL) {
                  iVar7 = piVar3[0x10];
                  goto LAB_001ebc48;
                }
                xmlXPathFreeObject(pxVar5);
                xmlXPtrFreeLocationSet(obj);
                iVar7 = 0x10;
                goto LAB_001ebcfa;
              }
            }
            else if (*piVar3 == 5) {
              node = *(xmlNodePtr *)(piVar3 + 10);
              iVar7 = piVar3[0xc];
LAB_001ebc48:
              pxVar4 = xmlXPtrNewPoint(node,iVar7);
              if (pxVar4 != (xmlXPathObjectPtr)0x0) {
                xmlXPtrLocationSetAdd(obj,pxVar4);
              }
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < *piVar2);
      }
      xmlXPathFreeObject(pxVar5);
      pxVar5 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
      if (pxVar5 == (xmlXPathObjectPtr)0x0) {
        xmlXPtrErrMemory("allocating locationset");
      }
      else {
        *(undefined8 *)pxVar5 = 0;
        pxVar5->nodesetval = (xmlNodeSetPtr)0x0;
        pxVar5->stringval = (xmlChar *)0x0;
        pxVar5->user = (void *)0x0;
        *(undefined8 *)&pxVar5->index = 0;
        pxVar5->user2 = (void *)0x0;
        *(undefined8 *)&pxVar5->boolval = 0;
        pxVar5->floatval = 0.0;
        *(undefined8 *)&pxVar5->index2 = 0;
        pxVar5->type = XPATH_LOCATIONSET;
        pxVar5->user = obj;
      }
      valuePush(ctxt,pxVar5);
      return;
    }
    xmlXPtrErrMemory("allocating locationset");
    xmlXPathFreeObject(pxVar5);
  }
  iVar7 = 0xf;
LAB_001ebcfa:
  xmlXPathErr(ctxt,iVar7);
  return;
}

Assistant:

static void
xmlXPtrEndPointFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr tmp, obj, point;
    xmlLocationSetPtr newset = NULL;
    xmlLocationSetPtr oldset = NULL;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET)))
        XP_ERROR(XPATH_INVALID_TYPE)

    obj = valuePop(ctxt);
    if (obj->type == XPATH_NODESET) {
	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(obj->nodesetval);
	xmlXPathFreeObject(obj);
	if (tmp == NULL)
            XP_ERROR(XPATH_MEMORY_ERROR)
	obj = tmp;
    }

    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
	xmlXPathFreeObject(obj);
        XP_ERROR(XPATH_MEMORY_ERROR);
    }
    oldset = (xmlLocationSetPtr) obj->user;
    if (oldset != NULL) {
	int i;

	for (i = 0; i < oldset->locNr; i++) {
	    tmp = oldset->locTab[i];
	    if (tmp == NULL)
		continue;
	    point = NULL;
	    switch (tmp->type) {
		case XPATH_POINT:
		    point = xmlXPtrNewPoint(tmp->user, tmp->index);
		    break;
		case XPATH_RANGE: {
		    xmlNodePtr node = tmp->user2;
		    if (node != NULL) {
			if ((node->type == XML_ATTRIBUTE_NODE) ||
                            (node->type == XML_NAMESPACE_DECL)) {
			    xmlXPathFreeObject(obj);
			    xmlXPtrFreeLocationSet(newset);
			    XP_ERROR(XPTR_SYNTAX_ERROR);
			}
			point = xmlXPtrNewPoint(node, tmp->index2);
		    } else if (tmp->user == NULL) {
			point = xmlXPtrNewPoint(node,
				       xmlXPtrNbLocChildren(node));
		    }
		    break;
	        }
		default:
		    /*** Should we raise an error ?
		    xmlXPathFreeObject(obj);
		    xmlXPathFreeObject(newset);
		    XP_ERROR(XPATH_INVALID_TYPE)
		    ***/
		    break;
	    }
            if (point != NULL)
		xmlXPtrLocationSetAdd(newset, point);
	}
    }
    xmlXPathFreeObject(obj);
    valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
}